

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainAI.cpp
# Opt level: O3

void __thiscall
tiger::trains::ai::TrainAI::TrainAI(TrainAI *this,BotSharedData *data,GoodType type,Train *train)

{
  int iVar1;
  
  (this->super_ISubBot)._vptr_ISubBot = (_func_int **)&PTR__TrainAI_00182fd0;
  this->sharedData = data;
  this->type = type;
  this->train = train;
  LineBlocker::LineBlocker(&this->lineBlocker,train,type,data);
  PathCalculator::PathCalculator(&this->pathCalculator,train,data);
  (this->goalPredict).
  super__Vector_base<std::pair<const_tiger::trains::world::IPost_*,_int>,_std::allocator<std::pair<const_tiger::trains::world::IPost_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->goalPredict).
  super__Vector_base<std::pair<const_tiger::trains::world::IPost_*,_int>,_std::allocator<std::pair<const_tiger::trains::world::IPost_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->currentPath).
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->goalPredict).
  super__Vector_base<std::pair<const_tiger::trains::world::IPost_*,_int>,_std::allocator<std::pair<const_tiger::trains::world::IPost_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentPath).
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentPath).
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->lastPoint = (Point *)0x0;
  this->nextPoint = (Point *)0x0;
  iVar1 = world::Train::getIdx(train);
  this->id = iVar1;
  return;
}

Assistant:

TrainAI::TrainAI(BotSharedData *data, models::GoodType type, world::Train *train)
    : sharedData(data), type(type), train(train), lineBlocker(train, type, data),
      pathCalculator(train, data), lastPoint(nullptr), nextPoint(nullptr)
{
    id = train->getIdx();
}